

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_AppStoreReceipt.cpp
# Opt level: O0

bool axl::cry::verifyAppStoreReceipt
               (AppStoreReceipt *receipt,void *p,size_t size,void *computerGuid,
               size_t computerGuidSize,uint_t flags)

{
  int iVar1;
  bio_st *pbVar2;
  x509_store_st *sig;
  char *pcVar3;
  ErrorRef *this;
  EVP_MD *type;
  size_t sVar4;
  long in_RDI;
  uint in_R9D;
  bool bVar5;
  bool isMatch;
  uchar_t digest [20];
  Array<char,_axl::sl::ArrayDetails<char>_> message;
  char buffer [256];
  AppStoreReceiptPayloadParser parser;
  BUF_MEM *bufMem;
  X509Store store;
  X509Cert appleRootCert;
  Bio bio;
  bool result;
  Pkcs7 pkcs7;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  AppStoreReceipt *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  size_t in_stack_fffffffffffffd48;
  BufKind bufKind;
  Array<char,_axl::sl::ArrayDetails<char>_> *in_stack_fffffffffffffd50;
  uchar *md;
  Pkcs7 *in_stack_fffffffffffffd58;
  byte local_233;
  uchar local_1f8 [24];
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> local_1e0 [11];
  AppStoreReceiptPayloadParser local_c8;
  BUF_MEM *local_98;
  Handle local_70 [8];
  Handle local_68 [8];
  Handle local_60 [8];
  undefined4 local_58;
  byte local_41;
  Pkcs7 local_40;
  uint local_34;
  long local_10;
  byte local_1;
  
  local_34 = in_R9D;
  local_10 = in_RDI;
  Pkcs7::Pkcs7((Pkcs7 *)0x14fa1c);
  local_41 = Pkcs7::loadDer(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                            in_stack_fffffffffffffd48);
  bufKind = (BufKind)(in_stack_fffffffffffffd48 >> 0x20);
  if ((bool)local_41) {
    Bio::Bio((Bio *)0x14fa9a);
    Bio::createMem((Bio *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
    if ((local_34 & 1) == 0) {
      X509Cert::X509Cert((X509Cert *)0x14fb3a);
      X509Store::X509Store((X509Store *)0x14fb49);
      sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
                ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)
                 CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                 (C *)in_stack_fffffffffffffd38,
                 CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
                 (bool)in_stack_fffffffffffffd2f);
      bVar5 = X509Cert::loadPem((X509Cert *)
                                CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                                (StringRef *)in_stack_fffffffffffffd38);
      local_233 = 0;
      if (bVar5) {
        bVar5 = X509Store::create((X509Store *)
                                  CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
        local_233 = 0;
        if (bVar5) {
          sl::Handle::operator_cast_to_x509_st_(local_68);
          bVar5 = X509Store::addCert((X509Store *)
                                     CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
                                     (X509 *)CONCAT17(in_stack_fffffffffffffd2f,
                                                      in_stack_fffffffffffffd28));
          local_233 = 0;
          if (bVar5) {
            sig = sl::Handle::operator_cast_to_x509_store_st_(local_70);
            pbVar2 = sl::Handle::operator_cast_to_bio_st_(local_60);
            iVar1 = Pkcs7::verify(&local_40,(EVP_PKEY_CTX *)0x0,(uchar *)sig,0,(uchar *)pbVar2,0);
            local_233 = (byte)iVar1;
          }
        }
      }
      local_41 = local_233 & 1;
      sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
                ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x14fca0);
      X509Store::~X509Store((X509Store *)0x14fcad);
      X509Cert::~X509Cert((X509Cert *)0x14fcba);
    }
    else {
      pbVar2 = sl::Handle::operator_cast_to_bio_st_(local_60);
      iVar1 = Pkcs7::verify(&local_40,(EVP_PKEY_CTX *)0x0,(uchar *)0x0,0,(uchar *)pbVar2,0x24);
      local_41 = (byte)iVar1 & 1;
    }
    if ((local_41 & 1) == 0) {
      local_1 = 0;
      local_58 = 1;
    }
    else {
      local_98 = Bio::getBufMem((Bio *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30)
                               );
      AppStoreReceiptPayloadParser::AppStoreReceiptPayloadParser(&local_c8);
      local_41 = AppStoreReceiptPayloadParser::parse
                           ((AppStoreReceiptPayloadParser *)
                            CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                            in_stack_fffffffffffffd38,
                            (void *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
                            CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
      if ((bool)local_41) {
        if ((local_34 & 2) == 0) {
          sl::Array<char,_axl::sl::ArrayDetails<char>_>::Array
                    (in_stack_fffffffffffffd50,bufKind,
                     (void *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                     (size_t)in_stack_fffffffffffffd38);
          sl::Array<char,_axl::sl::ArrayDetails<char>_>::append
                    ((Array<char,_axl::sl::ArrayDetails<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
                     (char *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),0x14fe35)
          ;
          sl::Array::operator_cast_to_char_((Array *)(local_10 + 200));
          sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::getCount
                    ((ArrayRef<char,_axl::sl::ArrayDetails<char>_> *)(local_10 + 200));
          sl::Array<char,_axl::sl::ArrayDetails<char>_>::append
                    ((Array<char,_axl::sl::ArrayDetails<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
                     (char *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),0x14fe84)
          ;
          sl::Array::operator_cast_to_char_((Array *)(local_10 + 0xb0));
          sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::getCount
                    ((ArrayRef<char,_axl::sl::ArrayDetails<char>_> *)(local_10 + 0xb0));
          sl::Array<char,_axl::sl::ArrayDetails<char>_>::append
                    ((Array<char,_axl::sl::ArrayDetails<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
                     (char *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),0x14fed3)
          ;
          pcVar3 = sl::Array::operator_cast_to_char_((Array *)local_1e0);
          this = (ErrorRef *)sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::getCount(local_1e0);
          md = local_1f8;
          type = EVP_sha1();
          EVP_Digest(pcVar3,(size_t)this,md,(uint *)0x0,type,(ENGINE *)0x0);
          sVar4 = sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::getCount
                            ((ArrayRef<char,_axl::sl::ArrayDetails<char>_> *)(local_10 + 0xe0));
          bVar5 = false;
          if (sVar4 == 0x14) {
            pcVar3 = sl::Array::operator_cast_to_char_((Array *)(local_10 + 0xe0));
            iVar1 = memcmp(pcVar3,local_1f8,0x14);
            bVar5 = iVar1 == 0;
          }
          if (bVar5) {
            local_1 = 1;
          }
          else {
            err::ErrorRef::ErrorRef(this,(char *)type);
            local_1 = err::fail((ErrorRef *)0x14ffdf);
            err::ErrorRef::~ErrorRef((ErrorRef *)0x14ffff);
          }
          local_58 = 1;
          sl::Array<char,_axl::sl::ArrayDetails<char>_>::~Array
                    ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x150065);
        }
        else {
          local_1 = 1;
          local_58 = 1;
        }
      }
      else {
        local_1 = 0;
        local_58 = 1;
      }
    }
    Bio::~Bio((Bio *)0x150083);
  }
  else {
    local_1 = 0;
    local_58 = 1;
  }
  Pkcs7::~Pkcs7((Pkcs7 *)0x1500a1);
  return (bool)(local_1 & 1);
}

Assistant:

bool
verifyAppStoreReceipt(
	AppStoreReceipt* receipt,
	const void* p,
	size_t size,
	const void* computerGuid,
	size_t computerGuidSize,
	uint_t flags
) {
	static const char appleRootCertPem[] =
		"-----BEGIN CERTIFICATE-----\n"
		"MIIEuzCCA6OgAwIBAgIBAjANBgkqhkiG9w0BAQUFADBiMQswCQYDVQQGEwJVUzET\n"
		"MBEGA1UEChMKQXBwbGUgSW5jLjEmMCQGA1UECxMdQXBwbGUgQ2VydGlmaWNhdGlv\n"
		"biBBdXRob3JpdHkxFjAUBgNVBAMTDUFwcGxlIFJvb3QgQ0EwHhcNMDYwNDI1MjE0\n"
		"MDM2WhcNMzUwMjA5MjE0MDM2WjBiMQswCQYDVQQGEwJVUzETMBEGA1UEChMKQXBw\n"
		"bGUgSW5jLjEmMCQGA1UECxMdQXBwbGUgQ2VydGlmaWNhdGlvbiBBdXRob3JpdHkx\n"
		"FjAUBgNVBAMTDUFwcGxlIFJvb3QgQ0EwggEiMA0GCSqGSIb3DQEBAQUAA4IBDwAw\n"
		"ggEKAoIBAQDkkakJH5HbHkdQ6wXtXnmELes2oldMVeyLGYne+Uts9QerIjAC6Bg+\n"
		"+FAJ039BqJj50cpmnCRrEdCju+QbKsMflZ56DKRHi1vUFjczy8QPTc4UadHJGXL1\n"
		"XQ7Vf1+b8iUDulWPTV0N8WQ1IxVLFVkds5T39pyez1C6wVhQZ48ItCD3y6wsIG9w\n"
		"tj8BMIy3Q88PnT3zK0koGsj+zrW5DtleHNbLPbU6rfQPDgCSC7EhFi501TwN22IW\n"
		"q6NxkkdTVcGvL0Gz+PvjcM3mo0xFfh9Ma1CWQYnEdGILEINBhzOKgbEwWOxaBDKM\n"
		"aLOPHd5lc/9nXmW8Sdh2nzMUZaF3lMktAgMBAAGjggF6MIIBdjAOBgNVHQ8BAf8E\n"
		"BAMCAQYwDwYDVR0TAQH/BAUwAwEB/zAdBgNVHQ4EFgQUK9BpR5R2Cf70a40uQKb3\n"
		"R01/CF4wHwYDVR0jBBgwFoAUK9BpR5R2Cf70a40uQKb3R01/CF4wggERBgNVHSAE\n"
		"ggEIMIIBBDCCAQAGCSqGSIb3Y2QFATCB8jAqBggrBgEFBQcCARYeaHR0cHM6Ly93\n"
		"d3cuYXBwbGUuY29tL2FwcGxlY2EvMIHDBggrBgEFBQcCAjCBthqBs1JlbGlhbmNl\n"
		"IG9uIHRoaXMgY2VydGlmaWNhdGUgYnkgYW55IHBhcnR5IGFzc3VtZXMgYWNjZXB0\n"
		"YW5jZSBvZiB0aGUgdGhlbiBhcHBsaWNhYmxlIHN0YW5kYXJkIHRlcm1zIGFuZCBj\n"
		"b25kaXRpb25zIG9mIHVzZSwgY2VydGlmaWNhdGUgcG9saWN5IGFuZCBjZXJ0aWZp\n"
		"Y2F0aW9uIHByYWN0aWNlIHN0YXRlbWVudHMuMA0GCSqGSIb3DQEBBQUAA4IBAQBc\n"
		"NplMLXi37Yyb3PN3m/J20ncwT8EfhYOFG5k9RzfyqZtAjizUsZAS2L70c5vu0mQP\n"
		"y3lPNNiiPvl4/2vIB+x9OYOLUyDTOMSxv5pPCmv/K/xZpwUJfBdAVhEedNO3iyM7\n"
		"R6PVbyTi69G3cN8PReEnyvFteO3ntRcXqNx+IjXKJdXZD9Zr1KIkIxH3oayPc4Fg\n"
		"xhtbCS+SsvhESPBgOJ4V9T0mZyCKM2r3DYLP3uujL/lTaltkwGMzd/c6ByxW69oP\n"
		"IQ7aunMZT7XZNn/Bh1XZp5m5MkL72NVxnn6hUrcbvZNCJBIqxw8dtk2cXmPIS4AX\n"
		"UKqK1drk/NAJBzewdXUh\n"
		"-----END CERTIFICATE-----\n";

	Pkcs7 pkcs7;
	bool result = pkcs7.loadDer(p, size);
	if (!result)
		return false;

	Bio bio;
	bio.createMem();

	if (flags & VerifyAppStoreReceiptFlag_SkipSignatureCheck) {
		result = pkcs7.verify(NULL, NULL, NULL, bio, PKCS7_NOVERIFY | PKCS7_NOSIGS);
	} else {
		X509Cert appleRootCert;
		X509Store store;

		result =
			appleRootCert.loadPem(sl::StringRef(appleRootCertPem, lengthof(appleRootCertPem))) &&
			store.create() &&
			store.addCert(appleRootCert) &&
			pkcs7.verify(NULL, store, NULL, bio, 0);
	}

	if (!result)
		return false;

	BUF_MEM* bufMem = bio.getBufMem();

	AppStoreReceiptPayloadParser parser;
	result = parser.parse(receipt, bufMem->data, bufMem->length);
	if (!result)
		return false;

	if (flags & VerifyAppStoreReceiptFlag_SkipHashCheck)
		return true;

	char buffer[256];
	sl::Array<char> message(rc::BufKind_Stack, buffer, sizeof(buffer));
	message.append((char*)computerGuid, computerGuidSize);
	message.append(receipt->m_opaque, receipt->m_opaque.getCount());
	message.append(receipt->m_rawBundleId, receipt->m_rawBundleId.getCount());

	uchar_t digest[20];
	EVP_Digest(message, message.getCount(), digest, NULL, EVP_sha1(), NULL);

	bool isMatch =
		receipt->m_sha1Hash.getCount() == sizeof(digest) &&
		memcmp(receipt->m_sha1Hash, digest, sizeof(digest)) == 0;

	if (!isMatch)
		return err::fail("app receipt SHA1 hash mismatch");

	return true;
}